

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherBase::Run(GatherBase *this)

{
  bool bVar1;
  uint uVar2;
  GLuint GVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  undefined1 local_48 [4];
  int i;
  Vec4 buffData;
  GLfloat colorf [4];
  GLenum local_1c;
  GatherBase *pGStack_18;
  GLenum drawBuffer;
  GatherBase *this_local;
  
  pGStack_18 = this;
  uVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x24])();
  if ((uVar2 & 1) == 0) {
    this_local = (GatherBase *)0x0;
  }
  else {
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])();
    glu::CallLogWrapper::glGenFramebuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &this->fbo);
    glu::CallLogWrapper::glGenRenderbuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &this->rbo);
    glu::CallLogWrapper::glBindRenderbuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8d41,
               this->rbo);
    glu::CallLogWrapper::glRenderbufferStorage
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8d41,
               0x8058,1,1);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8d40,
               this->fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8d40,
               0x8ce0,0x8d41,this->rbo);
    local_1c = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &local_1c);
    memset(buffData.m_data + 2,0,0x10);
    glu::CallLogWrapper::glClearBufferfv
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x1800,0
               ,buffData.m_data + 2);
    glu::CallLogWrapper::glViewport
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,0,1,1)
    ;
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &this->vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
               &this->vbo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8892,
               this->vbo);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,4,
               0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_48);
    glu::CallLogWrapper::glBufferData
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8892,
               0x10,local_48,0x88e4);
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      if (local_4c == 0) {
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])(local_90);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        GVar3 = TGBase::CreateProgram(&this->super_TGBase,pcVar5,pcVar6);
        this->program = GVar3;
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_70);
      }
      else {
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1c])(local_e0);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        GVar3 = TGBase::CreateProgram(&this->super_TGBase,pcVar5,pcVar6);
        this->program = GVar3;
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_c0);
      }
      glu::CallLogWrapper::glBindAttribLocation
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 this->program,0,"v_in_0");
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 this->program);
      bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,(bool *)0x0);
      if (!bVar1) {
        return (long)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glUseProgram
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 this->program);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,0,1)
      ;
      glu::CallLogWrapper::glReadBuffer
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8ce0
                );
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                 this->program);
      iVar4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1f])();
      if (CONCAT44(extraout_var,iVar4) == -1) {
        return (long)&DAT_ffffffffffffffff;
      }
    }
    iVar4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x25])();
    this_local = (GatherBase *)CONCAT44(extraout_var_00,iVar4);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 1);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		for (int i = 0; i < 2; ++i)
		{
			if (i == 0)
				program = CreateProgram(VertexShader().c_str(), FallthroughFragmentShader().c_str());
			else
				program = CreateProgram(FallthroughVertexShader().c_str(), FragmentShader().c_str());
			glBindAttribLocation(program, 0, "v_in_0");
			glLinkProgram(program);
			if (!CheckProgram(program))
				return ERROR;
			glUseProgram(program);

			glDrawArrays(GL_POINTS, 0, 1);
			glReadBuffer(GL_COLOR_ATTACHMENT0);

			glDeleteProgram(program);

			if (Verify() == ERROR)
				return ERROR;
		}

		return TestCompute();
	}